

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall kj::TaskSet::Task::fire(Task *this)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  PromiseArena *pPVar4;
  undefined8 uVar5;
  _func_int **pp_Var6;
  anon_class_8_1_8991fb9c *func;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  Event *extraout_RDX_02;
  Event *extraout_RDX_03;
  Event *pEVar7;
  long in_RSI;
  Exception *exception;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar8;
  OwnTask self;
  ExceptionOr<kj::_::Void> result;
  kj local_508 [8];
  undefined1 local_500 [16];
  _func_int **pp_Stack_4f0;
  EventLoop *pEStack_4e8;
  Event *local_4e0;
  Event **ppEStack_4d8;
  char *local_4d0;
  char *pcStack_4c8;
  ArrayDisposer *local_4c0;
  Disposer *pDStack_4b8;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> local_4b0;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *pMStack_4a8;
  TaskSet *local_4a0;
  OwnPromiseNode local_498;
  undefined1 local_490 [264];
  Detail *local_388;
  RemoveConst<kj::Exception::Detail> *pRStack_380;
  Detail *local_378;
  ArrayDisposer *pAStack_370;
  char local_368;
  undefined1 local_360 [40];
  char *local_338;
  char *local_330;
  ArrayDisposer *pAStack_328;
  Disposer *local_320;
  Own<kj::TaskSet::Task,_kj::_::PromiseDisposer> OStack_318;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *local_310;
  TaskSet *pTStack_308;
  PromiseNode *local_300;
  undefined1 local_2f8 [264];
  Detail *local_1f0;
  RemoveConst<kj::Exception::Detail> *pRStack_1e8;
  Detail *local_1e0;
  ArrayDisposer *pAStack_1d8;
  undefined1 local_1d0;
  Maybe<kj::Exception> local_1c8;
  
  local_368 = '\0';
  local_1d0 = 0;
  (**(code **)(**(long **)(in_RSI + 0x68) + 0x18))();
  runCatchingExceptions<kj::TaskSet::Task::fire()::_lambda()_1_>(&local_1c8,local_508,func);
  local_500[0] = local_1c8.ptr.isSet;
  if (local_1c8.ptr.isSet == true) {
    local_500._8_8_ = local_1c8.ptr.field_1.value.ownFile.content.ptr;
    pp_Stack_4f0 = (_func_int **)local_1c8.ptr.field_1.value.ownFile.content.size_;
    pEStack_4e8 = (EventLoop *)local_1c8.ptr.field_1.value.ownFile.content.disposer;
    local_1c8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.ownFile.content.size_ = 0;
    local_4e0 = (Event *)local_1c8.ptr.field_1.value.file;
    ppEStack_4d8 = (Event **)local_1c8.ptr.field_1._32_8_;
    local_4d0 = local_1c8.ptr.field_1.value.description.content.ptr;
    pcStack_4c8 = (char *)local_1c8.ptr.field_1.value.description.content.size_;
    local_4c0 = local_1c8.ptr.field_1.value.description.content.disposer;
    pDStack_4b8 = local_1c8.ptr.field_1.value.context.ptr.disposer;
    local_1c8.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.description.content.size_ = 0;
    local_4b0.ptr.ptr =
         (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>)
         (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>)local_1c8.ptr.field_1.value.context.ptr.ptr
    ;
    pMStack_4a8 = (Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)
                  local_1c8.ptr.field_1.value.remoteTrace.content.ptr;
    local_1c8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_4a0 = (TaskSet *)local_1c8.ptr.field_1.value.remoteTrace.content.size_;
    local_498.ptr = (PromiseNode *)local_1c8.ptr.field_1.value.remoteTrace.content.disposer;
    local_1c8.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy(local_490,(void *)((long)&local_1c8.ptr.field_1 + 0x68),0x105);
    local_388 = local_1c8.ptr.field_1.value.details.builder.ptr;
    pRStack_380 = local_1c8.ptr.field_1.value.details.builder.pos;
    local_378 = local_1c8.ptr.field_1.value.details.builder.endPtr;
    pAStack_370 = local_1c8.ptr.field_1.value.details.builder.disposer;
    local_1c8.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1c8.ptr.field_1.value.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1c8.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    Exception::~Exception(&local_1c8.ptr.field_1.value);
  }
  if (local_500[0] == '\x01') {
    if (local_368 == '\0') {
      local_360._0_8_ = local_500._8_8_;
      local_360._8_8_ = pp_Stack_4f0;
      local_360._16_8_ = pEStack_4e8;
      local_500._8_8_ = (PromiseArena *)0x0;
      pp_Stack_4f0 = (_func_int **)0x0;
      local_360._24_8_ = local_4e0;
      local_360._32_8_ = ppEStack_4d8;
      local_338 = local_4d0;
      local_330 = pcStack_4c8;
      pAStack_328 = local_4c0;
      local_4d0 = (char *)0x0;
      pcStack_4c8 = (char *)0x0;
      local_320 = pDStack_4b8;
      OStack_318 = local_4b0.ptr.ptr;
      local_4b0.ptr.ptr = (Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>)(Task *)0x0;
      local_310 = pMStack_4a8;
      pTStack_308 = local_4a0;
      local_300 = local_498.ptr;
      pMStack_4a8 = (Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)0x0;
      local_4a0 = (TaskSet *)0x0;
      memcpy(local_2f8,local_490,0x105);
      local_1f0 = local_388;
      pRStack_1e8 = pRStack_380;
      local_1e0 = local_378;
      pAStack_1d8 = pAStack_370;
      local_388 = (Detail *)0x0;
      pRStack_380 = (RemoveConst<kj::Exception::Detail> *)0x0;
      local_378 = (Detail *)0x0;
      local_368 = '\x01';
    }
    Exception::~Exception((Exception *)(local_500 + 8));
  }
  pop((Task *)local_500);
  lVar1 = *(long *)(in_RSI + 0x60);
  pEVar7 = *(Event **)(lVar1 + 0x18);
  if ((pEVar7 != (Event *)0x0) && (*(long *)(lVar1 + 8) == 0)) {
    (**(code **)(**(long **)(lVar1 + 0x18) + 0x10))(*(long **)(lVar1 + 0x18),&local_1c8);
    lVar1 = *(long *)(in_RSI + 0x60);
    puVar2 = *(undefined8 **)(lVar1 + 0x10);
    plVar3 = *(long **)(lVar1 + 0x18);
    *(undefined8 *)(lVar1 + 0x10) = 0;
    *(undefined8 *)(lVar1 + 0x18) = 0;
    pEVar7 = extraout_RDX;
    if (plVar3 != (long *)0x0) {
      (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      pEVar7 = extraout_RDX_00;
    }
  }
  if (local_368 == '\x01') {
    (*(code *)**(undefined8 **)**(undefined8 **)(in_RSI + 0x60))
              ((undefined8 *)**(undefined8 **)(in_RSI + 0x60),(Exception *)local_360);
    pEVar7 = extraout_RDX_01;
  }
  uVar5 = local_500._0_8_;
  pPVar4 = (PromiseArena *)(local_500._0_8_ + 0x10);
  if ((_func_int **)local_500._0_8_ == (_func_int **)0x0) {
    pp_Var6 = (_func_int **)0x0;
    pPVar4 = (PromiseArena *)0x0;
  }
  else {
    pp_Var6 = (_func_int **)(*(long *)(*(_func_int **)local_500._0_8_ + -0x10) + local_500._0_8_);
  }
  if (pp_Var6 == (_func_int **)local_500._0_8_) {
    pp_Var6 = (_func_int **)
              &kj::_::StaticDisposerAdapter<kj::TaskSet::Task,kj::_::PromiseDisposer>::instance;
  }
  else {
    pp_Var6 = (_func_int **)operator_new(0x10);
    *pp_Var6 = (_func_int *)&PTR___cxa_pure_virtual_006e1418;
    pp_Var6[1] = (_func_int *)uVar5;
    *pp_Var6 = (_func_int *)&PTR_disposeImpl_00709850;
    pEVar7 = extraout_RDX_02;
  }
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember = pp_Var6;
  (this->super_PromiseArenaMember).arena = pPVar4;
  local_500._0_8_ = (_func_int **)0x0;
  if (local_368 == '\x01') {
    Exception::~Exception((Exception *)local_360);
    pEVar7 = extraout_RDX_03;
  }
  MVar8.ptr.ptr = pEVar7;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar8.ptr;
}

Assistant:

Maybe<Own<Event>> fire() override {
    // Get the result.
    _::ExceptionOr<_::Void> result;
    node->get(result);

    // Delete the node, catching any exceptions.
    KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
      node = nullptr;
    })) {
      result.addException(kj::mv(exception));
    }

    // Remove from the task list. Do this before calling taskFailed(), so that taskFailed() can
    // safely call clear().
    auto self = pop();

    // We'll also process onEmpty() now, just in case `taskFailed()` actually destroys the whole
    // `TaskSet`.
    KJ_IF_SOME(f, taskSet.emptyFulfiller) {
      if (taskSet.tasks == kj::none) {
        f->fulfill();
        taskSet.emptyFulfiller = kj::none;
      }
    }

    // Call the error handler if there was an exception.
    KJ_IF_SOME(e, result.exception) {
      taskSet.errorHandler.taskFailed(kj::mv(e));
    }

    return Own<Event>(mv(self));
  }